

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbfCsvParser.c
# Opt level: O3

sbfError sbfCsvParser_next(FILE *f,char ***fields,u_int *nfields,u_char separator,u_int *line)

{
  long lVar1;
  char cVar2;
  char cVar3;
  u_int uVar4;
  sbfError sVar5;
  char ***pppcVar6;
  int iVar7;
  char *pcVar8;
  void *__ptr;
  char **ppcVar9;
  int *piVar10;
  undefined7 in_register_00000009;
  size_t sVar11;
  char *pcVar12;
  uint uVar13;
  size_t nmemb;
  size_t sVar14;
  size_t sVar15;
  size_t sVar16;
  bool bVar17;
  size_t len;
  size_t local_48;
  uint local_3c;
  char ***local_38;
  
  local_3c = (uint)CONCAT71(in_register_00000009,separator);
  do {
    pcVar8 = fgetln(f,&local_48);
    if (pcVar8 == (char *)0x0) {
      piVar10 = __errno_location();
      sVar5 = *piVar10;
      iVar7 = feof((FILE *)f);
      if (iVar7 != 0) {
        return 2;
      }
      return sVar5;
    }
    if (line != (u_int *)0x0) {
      *line = *line + 1;
    }
    bVar17 = true;
    pcVar12 = pcVar8;
    if (local_48 != 0) {
      pcVar12 = pcVar8 + local_48;
      do {
        sVar11 = local_48 - 1;
        if ((*pcVar8 != ' ') && (*pcVar8 != '\t')) {
          if (pcVar8[sVar11] != '\n') goto LAB_00104f0b;
          bVar17 = sVar11 == 0;
          pcVar12 = pcVar8;
          local_48 = sVar11;
          break;
        }
        pcVar8 = pcVar8 + 1;
        local_48 = sVar11;
      } while (sVar11 != 0);
    }
    pcVar8 = pcVar12;
  } while (bVar17);
LAB_00104f0b:
  *fields = (char **)0x0;
  *nfields = 0;
  uVar13 = local_3c & 0xff;
  sVar11 = 0;
  local_38 = fields;
joined_r0x00104f31:
  while( true ) {
    if (sVar11 == local_48) {
      pcVar8 = sbfMemory_strdup("");
      pppcVar6 = local_38;
      uVar4 = *nfields;
      *nfields = uVar4 + 1;
      ppcVar9 = (char **)sbfMemory_realloc(*local_38,(ulong)(uVar4 + 1),8);
      *pppcVar6 = ppcVar9;
      ppcVar9[*nfields - 1] = pcVar8;
      return 0;
    }
    cVar2 = pcVar8[sVar11];
    if ((cVar2 != ' ') && (cVar2 != '\t')) break;
    sVar11 = sVar11 + 1;
  }
  sVar15 = (cVar2 == '\"') + sVar11;
  bVar17 = true;
  if (sVar15 == local_48) {
    __ptr = (void *)0x0;
    sVar16 = local_48;
LAB_00104ff1:
    nmemb = 0;
    sVar11 = sVar16;
  }
  else {
    __ptr = (void *)0x0;
    sVar14 = 0;
    do {
      sVar16 = sVar15 + 1;
      cVar3 = pcVar8[sVar15];
      if ((cVar2 != '\"') && (cVar3 == (char)local_3c)) {
        if (sVar14 != 0) goto LAB_0010505a;
        bVar17 = false;
        goto LAB_00104ff1;
      }
      if ((cVar2 == '\"') && (cVar3 == '\"')) {
        nmemb = sVar14;
        sVar11 = local_48;
        if (sVar16 == local_48) break;
        if (pcVar8[sVar16] != '\"') {
          sVar15 = sVar15 + 2;
          goto LAB_00105090;
        }
        sVar16 = sVar15 + 2;
      }
      nmemb = sVar14 + 1;
      __ptr = sbfMemory_realloc(__ptr,nmemb,1);
      *(char *)((long)__ptr + sVar14) = cVar3;
      sVar14 = nmemb;
      sVar15 = sVar16;
      sVar11 = sVar16;
    } while (sVar16 != local_48);
  }
  goto LAB_00104ff6;
  while (sVar14 = sVar14 - 1, sVar14 != 0) {
LAB_0010505a:
    sVar11 = sVar16;
    if (*(char *)((long)__ptr + (sVar14 - 1)) != ' ') {
      bVar17 = false;
      nmemb = sVar14;
      goto LAB_00104ff6;
    }
  }
  bVar17 = false;
  nmemb = 0;
  goto LAB_00104ff6;
  while (lVar1 = (1 - local_48) + sVar15, sVar15 = sVar15 + 1, lVar1 != 1) {
LAB_00105090:
    cVar2 = pcVar8[sVar15 - 1];
    if ((cVar2 != ' ') && (cVar2 != '\t')) {
      sVar11 = sVar15;
      if ((int)cVar2 != uVar13) {
        if (__ptr != (void *)0x0) {
          free(__ptr);
        }
        sbfCsvParser_free(*local_38,*nfields);
        return 0x16;
      }
      break;
    }
  }
  bVar17 = sVar11 == local_48;
LAB_00104ff6:
  pcVar12 = (char *)sbfMemory_realloc(__ptr,nmemb + 1,1);
  pppcVar6 = local_38;
  pcVar12[nmemb] = '\0';
  uVar4 = *nfields;
  *nfields = uVar4 + 1;
  ppcVar9 = (char **)sbfMemory_realloc(*local_38,(ulong)(uVar4 + 1),8);
  *pppcVar6 = ppcVar9;
  ppcVar9[*nfields - 1] = pcVar12;
  if (bVar17) {
    return 0;
  }
  goto joined_r0x00104f31;
}

Assistant:

sbfError
sbfCsvParser_next (FILE* f,
                   char*** fields,
                   u_int* nfields,
                   u_char separator,
                   u_int* line)
{
    char*  buf;
    size_t len;
    size_t off;
    u_char c;
    char*  next;
    size_t nextlen;
    int    quoted;
    int    done;
    int    comma;
    int    saved_errno;

    do
    {
        buf = fgetln (f, &len);
        if (buf == NULL)
        {
            saved_errno = errno;
            if (feof (f))
                return ENOENT;
           return saved_errno;
        }
        if (line != NULL)
            (*line)++;
        while (len > 0 && (*buf == ' ' || *buf == '\t'))
        {
            buf++;
            len--;
        }
        if (len > 0 && buf[len - 1] == '\n')
            len--;
    }
    while (len == 0);

    *fields = NULL;
    *nfields = 0;

    off = 0;
    for (;;)
    {
        next = NULL;
        nextlen = 0;

        while (off != len && (buf[off] == ' ' || buf[off] == '\t'))
            off++;
        if (off == len)
        {
            sbfCsvParserAdd (fields, nfields, xstrdup (""));
            break;
        }

        quoted = buf[off] == '"';
        if (quoted)
            off++;

        comma = done = 0;
        while (off != len)
        {
            c = buf[off++];

            if (!quoted && c == separator)
            {
                while (nextlen > 0 && next[nextlen - 1] == ' ')
                    nextlen--;
                comma = 1;
                break;
            }
            if (quoted && c == '"')
            {
                if (off == len)
                    break;
                if (buf[off] != '"')
                {
                    while (off != len && (buf[off] == ' ' || buf[off] == '\t'))
                        off++;
                    if (off != len && buf[off++] != separator)
                        goto fail;
                    if (off != len)
                        comma = 1;
                    break;
                }
                else
                    off++;
            }

            sbfCsvParserExpand (&next, &nextlen, 1);
            next[nextlen - 1] = c;
        }

        sbfCsvParserExpand (&next, &nextlen, 1);
        next[nextlen - 1] = '\0';
        sbfCsvParserAdd (fields, nfields, next);

        if (!comma)
            break;
    }

    return 0;

fail:
    if (next != NULL)
        free (next);
    sbfCsvParser_free (*fields, *nfields);
    return EINVAL;
}